

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzerSettings::InitControllerData(AsyncRgbLedAnalyzerSettings *this)

{
  initializer_list<AsyncRgbLedAnalyzerSettings::LedControllerData> __l;
  double dVar1;
  double dVar2;
  double dVar3;
  LedControllerData *local_13c8;
  TimingTolerance local_e18;
  TimingTolerance local_e00;
  TimingTolerance local_de8;
  TimingTolerance local_dd0;
  allocator local_db3;
  allocator local_db2;
  undefined1 local_db1;
  TimingTolerance local_db0;
  TimingTolerance local_d98;
  TimingTolerance local_d80;
  TimingTolerance local_d68;
  allocator local_d4b;
  allocator local_d4a;
  undefined1 local_d49;
  TimingTolerance local_d48;
  TimingTolerance local_d30;
  TimingTolerance local_d18;
  TimingTolerance local_d00;
  TimingTolerance local_ce8;
  TimingTolerance local_cd0;
  TimingTolerance local_cb8;
  TimingTolerance local_ca0;
  allocator local_c83;
  allocator local_c82;
  undefined1 local_c81;
  TimingTolerance local_c80;
  TimingTolerance local_c68;
  TimingTolerance local_c50;
  TimingTolerance local_c38;
  allocator local_c1b;
  allocator local_c1a;
  undefined1 local_c19;
  TimingTolerance local_c18;
  TimingTolerance local_c00;
  TimingTolerance local_be8;
  TimingTolerance local_bd0;
  TimingTolerance local_bb8;
  TimingTolerance local_ba0;
  TimingTolerance local_b88;
  TimingTolerance local_b70;
  allocator local_b53;
  allocator local_b52;
  undefined1 local_b51;
  TimingTolerance local_b50;
  TimingTolerance local_b38;
  TimingTolerance local_b20;
  TimingTolerance local_b08;
  allocator local_aeb;
  allocator local_aea;
  undefined1 local_ae9;
  TimingTolerance local_ae8;
  TimingTolerance local_ad0;
  TimingTolerance local_ab8;
  TimingTolerance local_aa0;
  allocator local_a83;
  allocator local_a82;
  undefined1 local_a81;
  TimingTolerance local_a80;
  TimingTolerance local_a68;
  TimingTolerance local_a50;
  TimingTolerance local_a38;
  TimingTolerance local_a20;
  TimingTolerance local_a08;
  TimingTolerance local_9f0;
  TimingTolerance local_9d8;
  allocator local_9bd [20];
  allocator local_9a9;
  LedControllerData *local_9a8;
  LedControllerData local_9a0;
  string local_870 [32];
  string asStack_850 [32];
  undefined1 local_830;
  undefined1 local_82f;
  TimingTolerance TStack_828;
  BitTiming BStack_810;
  BitTiming BStack_7e0;
  undefined1 local_7b0;
  BitTiming BStack_7a8;
  BitTiming BStack_778;
  undefined4 local_748;
  string local_740 [32];
  string asStack_720 [32];
  undefined1 local_700;
  undefined1 local_6ff;
  TimingTolerance TStack_6f8;
  BitTiming BStack_6e0;
  BitTiming BStack_6b0;
  undefined1 local_680;
  BitTiming BStack_678;
  BitTiming BStack_648;
  undefined4 local_618;
  string local_610 [32];
  string asStack_5f0 [32];
  undefined1 local_5d0;
  undefined1 local_5cf;
  TimingTolerance TStack_5c8;
  BitTiming BStack_5b0;
  BitTiming BStack_580;
  undefined1 local_550;
  BitTiming BStack_548;
  BitTiming BStack_518;
  undefined4 local_4e8;
  string local_4e0 [32];
  string asStack_4c0 [32];
  undefined1 local_4a0;
  undefined1 local_49f;
  TimingTolerance TStack_498;
  BitTiming BStack_480;
  BitTiming BStack_450;
  undefined1 local_420;
  BitTiming BStack_418;
  BitTiming BStack_3e8;
  undefined4 local_3b8;
  string local_3b0 [32];
  string asStack_390 [32];
  undefined1 local_370;
  undefined1 local_36f;
  TimingTolerance TStack_368;
  BitTiming BStack_350;
  BitTiming BStack_320;
  undefined1 local_2f0;
  BitTiming BStack_2e8;
  BitTiming BStack_2b8;
  undefined4 local_288;
  string local_280 [32];
  string asStack_260 [32];
  undefined1 local_240;
  undefined1 local_23f;
  TimingTolerance TStack_238;
  BitTiming BStack_220;
  BitTiming BStack_1f0;
  undefined1 local_1c0;
  BitTiming BStack_1b8;
  BitTiming BStack_188;
  undefined4 local_158;
  string local_150 [32];
  string asStack_130 [32];
  undefined1 local_110;
  undefined1 local_10f;
  TimingTolerance TStack_108;
  BitTiming BStack_f0;
  BitTiming BStack_c0;
  undefined1 local_90;
  BitTiming BStack_88;
  BitTiming BStack_58;
  undefined4 local_28;
  iterator local_20;
  undefined8 local_18;
  AsyncRgbLedAnalyzerSettings *local_10;
  AsyncRgbLedAnalyzerSettings *this_local;
  
  local_9a8 = &local_9a0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a0,"WS2811",&local_9a9);
  local_a81 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9a0.mDescription,"Worldsemi 24-bit RGB controller",local_9bd);
  local_9a0.mBitsPerChannel = '\b';
  local_9a0.mChannelCount = '\x03';
  dVar1 = operator____us(0x32);
  dVar2 = operator____us(0x32);
  dVar3 = operator____us(0x32);
  TimingTolerance::TimingTolerance(&local_9a0.mResetTiming,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x15e);
  dVar2 = operator____ns(500);
  dVar3 = operator____ns(0x28a);
  TimingTolerance::TimingTolerance(&local_9d8,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x73a);
  dVar2 = operator____ns(2000);
  dVar3 = operator____ns(0x866);
  TimingTolerance::TimingTolerance(&local_9f0,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(local_9a0.mDataTiming,&local_9d8,&local_9f0);
  dVar1 = operator____ns(0x41a);
  dVar2 = operator____ns(0x4b0);
  dVar3 = operator____ns(0x546);
  TimingTolerance::TimingTolerance(&local_a08,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x47e);
  dVar2 = operator____ns(0x514);
  dVar3 = operator____ns(0x5aa);
  TimingTolerance::TimingTolerance(&local_a20,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(local_9a0.mDataTiming + 1,&local_a08,&local_a20);
  local_9a0.mHasHighSpeed = true;
  dVar1 = operator____ns(0xaf);
  dVar2 = operator____ns(0xfa);
  dVar3 = operator____ns(0x145);
  TimingTolerance::TimingTolerance(&local_a38,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x39d);
  dVar2 = operator____ns(1000);
  dVar3 = operator____ns(0x433);
  TimingTolerance::TimingTolerance(&local_a50,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(local_9a0.mDataTimingHighSpeed,&local_a38,&local_a50);
  dVar1 = operator____ns(0x20d);
  dVar2 = operator____ns(600);
  dVar3 = operator____ns(0x2a3);
  TimingTolerance::TimingTolerance(&local_a68,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x4c9);
  dVar2 = operator____ns(0x514);
  dVar3 = operator____ns(0x55f);
  TimingTolerance::TimingTolerance(&local_a80,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(local_9a0.mDataTimingHighSpeed + 1,&local_a68,&local_a80);
  local_9a0.mLayout = LAYOUT_RGB;
  local_a81 = 0;
  local_9a8 = (LedControllerData *)local_870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"WS2812B",&local_a82);
  local_ae9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_850,"Worldsemi 24-bit RGB integrated light-source",&local_a83);
  local_830 = 8;
  local_82f = 3;
  dVar1 = operator____us(0x32);
  dVar2 = operator____us(0x32);
  dVar3 = operator____us(0x32);
  TimingTolerance::TimingTolerance(&TStack_828,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(200);
  dVar2 = operator____ns(400);
  dVar3 = operator____ns(0x226);
  TimingTolerance::TimingTolerance(&local_aa0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(700);
  dVar2 = operator____ns(0x352);
  dVar3 = operator____ns(0x41a);
  TimingTolerance::TimingTolerance(&local_ab8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_810,&local_aa0,&local_ab8);
  dVar1 = operator____ns(0x28a);
  dVar2 = operator____ns(800);
  dVar3 = operator____ns(0x41a);
  TimingTolerance::TimingTolerance(&local_ad0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(200);
  dVar2 = operator____ns(0x1c2);
  dVar3 = operator____ns(600);
  TimingTolerance::TimingTolerance(&local_ae8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_7e0,&local_ad0,&local_ae8);
  local_7b0 = 0;
  BitTiming::BitTiming(&BStack_7a8);
  BitTiming::BitTiming(&BStack_778);
  local_748 = 1;
  local_ae9 = 0;
  local_9a8 = (LedControllerData *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"WS2813",&local_aea);
  local_b51 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_720,"Worldsemi 24-bit RGB integrated light-source",&local_aeb);
  local_700 = 8;
  local_6ff = 3;
  dVar1 = operator____us(0x32);
  dVar2 = operator____us(0x32);
  dVar3 = operator____us(0x32);
  TimingTolerance::TimingTolerance(&TStack_6f8,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(300);
  dVar2 = operator____ns(0x177);
  dVar3 = operator____ns(0x1c2);
  TimingTolerance::TimingTolerance(&local_b08,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(300);
  dVar2 = operator____ns(0x36b);
  dVar3 = operator____us(100);
  TimingTolerance::TimingTolerance(&local_b20,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_6e0,&local_b08,&local_b20);
  dVar1 = operator____ns(0x2ee);
  dVar2 = operator____ns(0x36b);
  dVar3 = operator____ns(1000);
  TimingTolerance::TimingTolerance(&local_b38,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(300);
  dVar2 = operator____ns(0x177);
  dVar3 = operator____us(100);
  TimingTolerance::TimingTolerance(&local_b50,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_6b0,&local_b38,&local_b50);
  local_680 = 0;
  BitTiming::BitTiming(&BStack_678);
  BitTiming::BitTiming(&BStack_648);
  local_618 = 1;
  local_b51 = 0;
  local_9a8 = (LedControllerData *)local_610;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"TM1809",&local_b52);
  local_c19 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_5f0,"Titan Micro 9-chanel 24-bit RGB controller",&local_b53);
  local_5d0 = 8;
  local_5cf = 9;
  dVar1 = operator____us(0x18);
  dVar2 = operator____us(0x18);
  TimingTolerance::TimingTolerance(&TStack_5c8,dVar1,dVar2,1.0);
  dVar1 = operator____ns(0x1c2);
  dVar2 = operator____ns(600);
  dVar3 = operator____ns(0x2ee);
  TimingTolerance::TimingTolerance(&local_b70,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x41a);
  dVar2 = operator____ns(0x4b0);
  dVar3 = operator____ns(0x546);
  TimingTolerance::TimingTolerance(&local_b88,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_5b0,&local_b70,&local_b88);
  dVar1 = operator____ns(0x41a);
  dVar2 = operator____ns(0x4b0);
  dVar3 = operator____ns(0x546);
  TimingTolerance::TimingTolerance(&local_ba0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x1c2);
  dVar2 = operator____ns(600);
  dVar3 = operator____ns(0x2ee);
  TimingTolerance::TimingTolerance(&local_bb8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_580,&local_ba0,&local_bb8);
  local_550 = 1;
  dVar1 = operator____ns(0xfa);
  dVar2 = operator____ns(0x140);
  dVar3 = operator____ns(0x186);
  TimingTolerance::TimingTolerance(&local_bd0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x212);
  dVar2 = operator____ns(600);
  dVar3 = operator____ns(0x29e);
  TimingTolerance::TimingTolerance(&local_be8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_548,&local_bd0,&local_be8);
  dVar1 = operator____ns(0x212);
  dVar2 = operator____ns(600);
  dVar3 = operator____ns(0x29e);
  TimingTolerance::TimingTolerance(&local_c00,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0xfa);
  dVar2 = operator____ns(0x140);
  dVar3 = operator____ns(0x186);
  TimingTolerance::TimingTolerance(&local_c18,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_518,&local_c00,&local_c18);
  local_4e8 = 0;
  local_c19 = 0;
  local_9a8 = (LedControllerData *)local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"TM1804",&local_c1a);
  local_c81 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_4c0,"Titan Micro 24-bit RGB controller",&local_c1b);
  local_4a0 = 8;
  local_49f = 3;
  dVar1 = operator____us(10);
  dVar2 = operator____us(10);
  TimingTolerance::TimingTolerance(&TStack_498,dVar1,dVar2,1.0);
  dVar1 = operator____ns(0x352);
  dVar2 = operator____us(1);
  dVar3 = operator____ns(0x47e);
  TimingTolerance::TimingTolerance(&local_c38,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x73a);
  dVar2 = operator____us(2);
  dVar3 = operator____ns(0x866);
  TimingTolerance::TimingTolerance(&local_c50,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_480,&local_c38,&local_c50);
  dVar1 = operator____ns(0x73a);
  dVar2 = operator____us(2);
  dVar3 = operator____ns(0x866);
  TimingTolerance::TimingTolerance(&local_c68,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x352);
  dVar2 = operator____us(1);
  dVar3 = operator____ns(0x47e);
  TimingTolerance::TimingTolerance(&local_c80,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_450,&local_c68,&local_c80);
  local_420 = 0;
  BitTiming::BitTiming(&BStack_418);
  BitTiming::BitTiming(&BStack_3e8);
  local_3b8 = 0;
  local_c81 = 0;
  local_9a8 = (LedControllerData *)local_3b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"UCS1903",&local_c82);
  local_d49 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_390,"UCS1903 24-bit RGB controller",&local_c83);
  local_370 = 8;
  local_36f = 3;
  dVar1 = operator____us(0x18);
  dVar2 = operator____us(0x18);
  TimingTolerance::TimingTolerance(&TStack_368,dVar1,dVar2,1.0);
  dVar1 = operator____ns(0x15e);
  dVar2 = operator____ns(500);
  dVar3 = operator____ns(0x28a);
  TimingTolerance::TimingTolerance(&local_ca0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x73a);
  dVar2 = operator____ns(2000);
  dVar3 = operator____ns(0x866);
  TimingTolerance::TimingTolerance(&local_cb8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_350,&local_ca0,&local_cb8);
  dVar1 = operator____ns(0x73a);
  dVar2 = operator____ns(2000);
  dVar3 = operator____ns(0x866);
  TimingTolerance::TimingTolerance(&local_cd0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x15e);
  dVar2 = operator____ns(500);
  dVar3 = operator____ns(0x28a);
  TimingTolerance::TimingTolerance(&local_ce8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_320,&local_cd0,&local_ce8);
  local_2f0 = 1;
  dVar1 = operator____ns(0xaf);
  dVar2 = operator____ns(0xfa);
  dVar3 = operator____ns(0x145);
  TimingTolerance::TimingTolerance(&local_d00,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x39d);
  dVar2 = operator____ns(1000);
  dVar3 = operator____ns(0x433);
  TimingTolerance::TimingTolerance(&local_d18,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_2e8,&local_d00,&local_d18);
  dVar1 = operator____ns(0x39d);
  dVar2 = operator____ns(1000);
  dVar3 = operator____ns(0x433);
  TimingTolerance::TimingTolerance(&local_d30,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0xaf);
  dVar2 = operator____ns(0xfa);
  dVar3 = operator____ns(0x145);
  TimingTolerance::TimingTolerance(&local_d48,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_2b8,&local_d30,&local_d48);
  local_288 = 0;
  local_d49 = 0;
  local_9a8 = (LedControllerData *)local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"LPD1886 - 24 bit",&local_d4a);
  local_db1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_260,"LPD1886 RGB controller in 24-bit mode",&local_d4b);
  local_240 = 8;
  local_23f = 3;
  dVar1 = operator____us(0x18);
  dVar2 = operator____us(0x1e);
  TimingTolerance::TimingTolerance(&TStack_238,dVar1,dVar2,1.0);
  dVar1 = operator____ns(0x96);
  dVar2 = operator____ns(200);
  dVar3 = operator____ns(0x118);
  TimingTolerance::TimingTolerance(&local_d68,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(500);
  dVar2 = operator____ns(600);
  dVar3 = operator____us(10);
  TimingTolerance::TimingTolerance(&local_d80,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_220,&local_d68,&local_d80);
  dVar1 = operator____ns(0x1c2);
  dVar2 = operator____ns(600);
  dVar3 = operator____us(9);
  TimingTolerance::TimingTolerance(&local_d98,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x96);
  dVar2 = operator____ns(200);
  dVar3 = operator____us(10);
  TimingTolerance::TimingTolerance(&local_db0,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_1f0,&local_d98,&local_db0);
  local_1c0 = 0;
  BitTiming::BitTiming(&BStack_1b8);
  BitTiming::BitTiming(&BStack_188);
  local_158 = 0;
  local_db1 = 0;
  local_9a8 = (LedControllerData *)local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"LPD1886 - 36 bit",&local_db2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_130,"LPD1886 RGB controller in 36-bit mode",&local_db3);
  local_110 = 0xc;
  local_10f = 3;
  dVar1 = operator____us(0x18);
  dVar2 = operator____us(0x1e);
  TimingTolerance::TimingTolerance(&TStack_108,dVar1,dVar2,1.0);
  dVar1 = operator____ns(0x96);
  dVar2 = operator____ns(200);
  dVar3 = operator____ns(0x118);
  TimingTolerance::TimingTolerance(&local_dd0,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(500);
  dVar2 = operator____ns(600);
  dVar3 = operator____us(10);
  TimingTolerance::TimingTolerance(&local_de8,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_f0,&local_dd0,&local_de8);
  dVar1 = operator____ns(0x1c2);
  dVar2 = operator____ns(600);
  dVar3 = operator____us(9);
  TimingTolerance::TimingTolerance(&local_e00,dVar1,dVar2,dVar3);
  dVar1 = operator____ns(0x96);
  dVar2 = operator____ns(200);
  dVar3 = operator____us(10);
  TimingTolerance::TimingTolerance(&local_e18,dVar1,dVar2,dVar3);
  BitTiming::BitTiming(&BStack_c0,&local_e00,&local_e18);
  local_90 = 0;
  BitTiming::BitTiming(&BStack_88);
  BitTiming::BitTiming(&BStack_58);
  local_28 = 0;
  local_20 = &local_9a0;
  local_18 = 8;
  __l._M_len = 8;
  __l._M_array = local_20;
  std::
  vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  ::operator=(&this->mControllers,__l);
  local_13c8 = (LedControllerData *)&local_20;
  do {
    local_13c8 = local_13c8 + -1;
    LedControllerData::~LedControllerData(local_13c8);
  } while (local_13c8 != &local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db3);
  std::allocator<char>::~allocator((allocator<char> *)&local_db2);
  std::allocator<char>::~allocator((allocator<char> *)&local_d4b);
  std::allocator<char>::~allocator((allocator<char> *)&local_d4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_c83);
  std::allocator<char>::~allocator((allocator<char> *)&local_c82);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_b53);
  std::allocator<char>::~allocator((allocator<char> *)&local_b52);
  std::allocator<char>::~allocator((allocator<char> *)&local_aeb);
  std::allocator<char>::~allocator((allocator<char> *)&local_aea);
  std::allocator<char>::~allocator((allocator<char> *)&local_a83);
  std::allocator<char>::~allocator((allocator<char> *)&local_a82);
  std::allocator<char>::~allocator((allocator<char> *)local_9bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::InitControllerData()
{
    // order of values here must correspond to the Controller enum
    mControllers = {
        // name, description, bits per channel, channels per frame, reset time nsec, low-speed data nsec, has high speed, high speed data
        // nsec, color layout

        // https://cdn-shop.adafruit.com/datasheets/WS2811.pdf
        { "WS2811",
          "Worldsemi 24-bit RGB controller",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } },    // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 1150_ns, 1300_ns, 1450_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 525_ns, 600_ns, 675_ns }, { 1225_ns, 1300_ns, 1375_ns } } // 1-bit times
          },
          LAYOUT_RGB },
        // https://cdn-shop.adafruit.com/datasheets/WS2812B.pdf
        // http://www.seeedstudio.com/document/pdf/WS2812B%20Datasheet.pdf
        { "WS2812B",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 200_ns, 400_ns, 550_ns }, { 700_ns, 850_ns, 1050_ns } }, // 0-bit times
              { { 650_ns, 800_ns, 1050_ns }, { 200_ns, 450_ns, 600_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // http://www.led-color.com/upload/201609/WS2813%20LED.pdf
        { "WS2813",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 300_ns, 375_ns, 450_ns }, { 300_ns, 875_ns, 100_us } },  // 0-bit times
              { { 750_ns, 875_ns, 1000_ns }, { 300_ns, 375_ns, 100_us } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // https://www.deskontrol.net/descargas/datasheets/TM1809.pdf
        { "TM1809",
          "Titan Micro 9-chanel 24-bit RGB controller",
          8,
          9,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 450_ns, 600_ns, 750_ns }, { 1050_ns, 1200_ns, 1350_ns } }, // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 450_ns, 600_ns, 750_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 250_ns, 320_ns, 390_ns }, { 530_ns, 600_ns, 670_ns } }, // 0-bit times
              { { 530_ns, 600_ns, 670_ns }, { 250_ns, 320_ns, 390_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.deskontrol.net/descargas/datasheets/TM1804.pdf
        { "TM1804",
          "Titan Micro 24-bit RGB controller",
          8,
          3,
          { 10_us, 10_us, 1.0 },
          {
              // low-speed times
              { { 850_ns, 1_us, 1150_ns }, { 1850_ns, 2_us, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2_us, 2150_ns }, { 850_ns, 1_us, 1150_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        // http://www.bestlightingbuy.com/pdf/UCS1903%20datasheet.pdf
        { "UCS1903",
          "UCS1903 24-bit RGB controller",
          8,
          3,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2000_ns, 2150_ns }, { 350_ns, 500_ns, 650_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 925_ns, 1000_ns, 1075_ns }, { 175_ns, 250_ns, 325_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.syncrolight.co.uk/datasheets/LPD1886%20datasheet.pdf
        { "LPD1886 - 24 bit",
          "LPD1886 RGB controller in 24-bit mode",
          8,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        { "LPD1886 - 36 bit",
          "LPD1886 RGB controller in 36-bit mode",
          12,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },
    };
}